

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

uint * If_DsdObjHashLookup(If_DsdMan_t *p,int Type,int *pLits,int nLits,int truthId)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  
  uVar2 = nLits * 0x1fd3 + Type * 0x1ec1;
  if (nLits < 1) {
    uVar4 = 0;
  }
  else {
    uVar5 = 0;
    do {
      uVar2 = uVar2 + (&If_DsdObjHashKey_s_Primes)[(uint)uVar5 & 0xf] * pLits[uVar5];
      uVar5 = uVar5 + 1;
    } while ((uint)nLits != uVar5);
    uVar4 = nLits & 0xf;
  }
  if (Type == 6) {
    uVar2 = uVar2 + (&If_DsdObjHashKey_s_Primes)[uVar4] * truthId;
  }
  puVar6 = p->pBins + (ulong)uVar2 % (ulong)(uint)p->nBins;
  uVar2 = *puVar6;
  if (uVar2 != 0) {
    do {
      if (((int)uVar2 < 0) || ((p->vObjs).nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      piVar1 = (int *)(p->vObjs).pArray[uVar2];
      uVar2 = piVar1[1];
      if ((uVar2 >> 0x1b == nLits && (uVar2 & 7) == Type) &&
         (iVar3 = bcmp(piVar1 + 2,pLits,(ulong)(uint)(nLits * 4)), iVar3 == 0)) {
        iVar3 = -1;
        if (0x17ffffff < uVar2 && Type == 6) {
          iVar3 = *piVar1;
          if (((long)iVar3 < 0) || ((p->vTruths).nSize <= iVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar3 = (p->vTruths).pArray[iVar3];
        }
        if (iVar3 == truthId) {
          p->nUniqueHits = p->nUniqueHits + 1;
          return puVar6;
        }
      }
      iVar3 = *piVar1;
      if (((long)iVar3 < 0) || ((p->vNexts).nSize <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      puVar6 = (uint *)((p->vNexts).pArray + iVar3);
      uVar2 = *puVar6;
    } while (uVar2 != 0);
  }
  p->nUniqueMisses = p->nUniqueMisses + 1;
  return puVar6;
}

Assistant:

unsigned * If_DsdObjHashLookup( If_DsdMan_t * p, int Type, int * pLits, int nLits, int truthId )
{
    If_DsdObj_t * pObj;
    unsigned * pSpot = p->pBins + If_DsdObjHashKey(p, Type, pLits, nLits, truthId);
    for ( ; *pSpot; pSpot = (unsigned *)Vec_IntEntryP(&p->vNexts, pObj->Id) )
    {
        pObj = If_DsdVecObj( &p->vObjs, *pSpot );
        if ( If_DsdObjType(pObj) == Type && 
             If_DsdObjFaninNum(pObj) == nLits && 
             !memcmp(pObj->pFans, pLits, sizeof(int)*If_DsdObjFaninNum(pObj)) &&
             truthId == If_DsdObjTruthId(p, pObj) )
        {
            p->nUniqueHits++;
            return pSpot;
        }
    }
    p->nUniqueMisses++;
    return pSpot;
}